

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *from)

{
  ThreadSafeArena *this_00;
  long *plVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  void **ppvVar5;
  RepeatedPtrFieldBase *pRVar6;
  Rep *pRVar7;
  string *psVar8;
  Nonnull<const_char_*> pcVar9;
  undefined8 extraout_RAX;
  int iVar10;
  int iVar11;
  RepeatedPtrFieldBase *pRVar12;
  
  if (from == this) {
    pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from,this,"&from != this");
  }
  else {
    pcVar9 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar9 != (Nonnull<const_char_*>)0x0) {
    MergeFrom<std::__cxx11::string>();
    operator_delete(from,0x20);
    _Unwind_Resume(extraout_RAX);
  }
  iVar10 = from->current_size_ + this->current_size_;
  iVar3 = this->capacity_proxy_ + 1;
  iVar11 = iVar10 - iVar3;
  if (iVar11 == 0 || iVar10 < iVar3) {
    pRVar6 = this;
    if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
      pRVar7 = rep(this);
      pRVar6 = (RepeatedPtrFieldBase *)pRVar7->elements;
    }
    ppvVar5 = &pRVar6->tagged_rep_or_elem_ + this->current_size_;
  }
  else {
    ppvVar5 = InternalExtend(this,iVar11);
  }
  pRVar6 = from;
  if (((ulong)from->tagged_rep_or_elem_ & 1) != 0) {
    pRVar7 = rep(from);
    pRVar6 = (RepeatedPtrFieldBase *)pRVar7->elements;
  }
  iVar3 = from->current_size_;
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    uVar4 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
  }
  else {
    pRVar7 = rep(this);
    uVar4 = pRVar7->allocated_size;
  }
  iVar11 = uVar4 - this->current_size_;
  if (from->current_size_ < iVar11) {
    iVar11 = from->current_size_;
  }
  pRVar12 = pRVar6;
  if (0 < iVar11) {
    do {
      std::__cxx11::string::_M_assign((string *)*ppvVar5);
      ppvVar5 = ppvVar5 + 1;
      pRVar12 = (RepeatedPtrFieldBase *)&pRVar12->current_size_;
    } while (pRVar12 < &pRVar6->tagged_rep_or_elem_ + iVar11);
  }
  this_00 = &this->arena_->impl_;
  if (this_00 == (ThreadSafeArena *)0x0) {
    for (; pRVar12 < (RepeatedPtrFieldBase *)(&pRVar6->tagged_rep_or_elem_ + iVar3);
        pRVar12 = (RepeatedPtrFieldBase *)&pRVar12->current_size_) {
      psVar8 = (string *)operator_new(0x20);
      plVar1 = (long *)pRVar12->tagged_rep_or_elem_;
      *(string **)psVar8 = psVar8 + 0x10;
      lVar2 = *plVar1;
      std::__cxx11::string::_M_construct<char*>(psVar8,lVar2,plVar1[1] + lVar2);
      *ppvVar5 = psVar8;
      ppvVar5 = ppvVar5 + 1;
    }
  }
  else {
    for (; pRVar12 < (RepeatedPtrFieldBase *)(&pRVar6->tagged_rep_or_elem_ + iVar3);
        pRVar12 = (RepeatedPtrFieldBase *)&pRVar12->current_size_) {
      plVar1 = (long *)pRVar12->tagged_rep_or_elem_;
      psVar8 = (string *)ThreadSafeArena::AllocateFromStringBlock(this_00);
      *(string **)psVar8 = psVar8 + 0x10;
      lVar2 = *plVar1;
      std::__cxx11::string::_M_construct<char*>(psVar8,lVar2,plVar1[1] + lVar2);
      *ppvVar5 = psVar8;
      ppvVar5 = ppvVar5 + 1;
    }
  }
  this->current_size_ = iVar10;
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    uVar4 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
  }
  else {
    pRVar7 = rep(this);
    uVar4 = pRVar7->allocated_size;
  }
  if ((int)uVar4 < iVar10) {
    pRVar7 = rep(this);
    pRVar7->allocated_size = iVar10;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFrom<std::string>(
    const RepeatedPtrFieldBase& from) {
  Prefetch5LinesFrom1Line(&from);
  ABSL_DCHECK_NE(&from, this);
  int new_size = current_size_ + from.current_size_;
  auto dst = reinterpret_cast<std::string**>(InternalReserve(new_size));
  auto src = reinterpret_cast<std::string* const*>(from.elements());
  auto end = src + from.current_size_;
  auto end_assign = src + std::min(ClearedCount(), from.current_size_);
  for (; src < end_assign; ++dst, ++src) {
    (*dst)->assign(**src);
  }
  if (Arena* const arena = arena_) {
    for (; src < end; ++dst, ++src) {
      *dst = Arena::Create<std::string>(arena, **src);
    }
  } else {
    for (; src < end; ++dst, ++src) {
      *dst = new std::string(**src);
    }
  }
  ExchangeCurrentSize(new_size);
  if (new_size > allocated_size()) {
    rep()->allocated_size = new_size;
  }
}